

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  BYTE *pBVar3;
  int iVar4;
  BYTE *pBVar5;
  fixed_t fVar6;
  long lVar7;
  
  pBVar3 = dc_source;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar7 = (long)dc_pitch;
    pBVar5 = dc_dest;
    iVar4 = dc_count;
    fVar6 = dc_texturefrac;
    do {
      *pBVar5 = plVar1[pBVar3[fVar6 >> 0x10]];
      pBVar5 = pBVar5 + lVar7;
      fVar6 = fVar6 + fVar2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void R_DrawColumnP_C (void)
{
	int 				count;
	BYTE*				dest;
	fixed_t 			frac;
	fixed_t 			fracstep;

	count = dc_count;

	// Zero length, column does not exceed a pixel.
	if (count <= 0)
		return;

	// Framebuffer destination address.
	dest = dc_dest;

	// Determine scaling,
	//	which is the only mapping to be done.
	fracstep = dc_iscale; 
	frac = dc_texturefrac;

	{
		// [RH] Get local copies of these variables so that the compiler
		//		has a better chance of optimizing this well.
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;

		// Inner loop that does the actual texture mapping,
		//	e.g. a DDA-lile scaling.
		// This is as fast as it gets.
		do
		{
			// Re-map color indices from wall texture column
			//	using a lighting/special effects LUT.
			*dest = colormap[source[frac>>FRACBITS]];

			dest += pitch;
			frac += fracstep;

		} while (--count);
	}
}